

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  Mat *top_blob;
  Mat *bottom_blob1;
  Mat *bottom_blob;
  Option *in_stack_000008f0;
  Mat *in_stack_000008f8;
  Mat *in_stack_00000900;
  Mat *in_stack_00000908;
  Option *in_stack_000009d0;
  Mat *in_stack_000009d8;
  Mat *in_stack_000009e0;
  Mat *in_stack_000009e8;
  undefined4 local_4;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  if (*(int *)(in_RDI + 0xb8) == 0) {
    local_4 = binary_op<std::plus<float>>
                        (in_stack_000009e8,in_stack_000009e0,in_stack_000009d8,in_stack_000009d0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 1) {
    local_4 = binary_op<std::minus<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 2) {
    local_4 = binary_op<std::multiplies<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 3) {
    local_4 = binary_op<std::divides<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 4) {
    local_4 = binary_op<ncnn::binary_op_max<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 5) {
    local_4 = binary_op<ncnn::binary_op_min<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 6) {
    local_4 = binary_op<ncnn::binary_op_pow<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 7) {
    local_4 = binary_op<ncnn::binary_op_rsub<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else if (*(int *)(in_RDI + 0xb8) == 8) {
    local_4 = binary_op<ncnn::binary_op_rdiv<float>>
                        (in_stack_00000908,in_stack_00000900,in_stack_000008f8,in_stack_000008f0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}